

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O0

bool __thiscall HashTbl::Contains(HashTbl *this,LPCOLESTR prgch,int32 cch)

{
  bool bVar1;
  ULONG UVar2;
  Ident *local_30;
  Ident *pid;
  uint32 luHash;
  int32 cch_local;
  LPCOLESTR prgch_local;
  HashTbl *this_local;
  
  UVar2 = CaseSensitiveComputeHash(prgch,prgch + cch);
  local_30 = this->m_prgpidName[UVar2 & this->m_luMask];
  while( true ) {
    if (local_30 == (Ident *)0x0) {
      return false;
    }
    if (((local_30->m_luHash == UVar2) && (local_30->m_cch == cch)) &&
       (bVar1 = CharsAreEqual((LPCOLESTR)&local_30->field_0x22,prgch + cch,prgch), bVar1)) break;
    local_30 = local_30->m_pidNext;
  }
  return true;
}

Assistant:

bool HashTbl::Contains(_In_reads_(cch) LPCOLESTR prgch, int32 cch)
{
    uint32 luHash = CaseSensitiveComputeHash(prgch, prgch + cch);

    for (auto pid = m_prgpidName[luHash & m_luMask]; pid; pid = pid->m_pidNext)
    {
        if (pid->m_luHash == luHash && (int)pid->m_cch == cch &&
            HashTbl::CharsAreEqual(pid->m_sz, prgch + cch, prgch))
        {
            return true;
        }
    }

    return false;
}